

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Spc_Cpu.cpp
# Opt level: O1

Timer * __thiscall Snes_Spc::run_timer_(Snes_Spc *this,Timer *t,rel_time_t time)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  
  iVar2 = (time - t->next_time) / t->prescaler + 1;
  t->next_time = t->prescaler * iVar2 + t->next_time;
  if (t->enabled != 0) {
    iVar1 = t->period;
    iVar3 = (t->divider - iVar1 | 0xffffff00U) + iVar2;
    if (iVar3 < 0) {
      uVar4 = t->divider + iVar2;
    }
    else {
      uVar4 = iVar3 % iVar1;
      t->counter = iVar3 / iVar1 + t->counter + 1U & 0xf;
    }
    t->divider = uVar4 & 0xff;
  }
  return t;
}

Assistant:

Snes_Spc::Timer* Snes_Spc::run_timer_( Timer* t, rel_time_t time )
{
	int elapsed = TIMER_DIV( t, time - t->next_time ) + 1;
	t->next_time += TIMER_MUL( t, elapsed );
	
	if ( t->enabled )
	{
		int remain = IF_0_THEN_256( t->period - t->divider );
		int divider = t->divider + elapsed;
		int over = elapsed - remain;
		if ( over >= 0 )
		{
			int n = over / t->period;
			t->counter = (t->counter + 1 + n) & 0x0F;
			divider = over - n * t->period;
		}
		t->divider = (uint8_t) divider;
	}
	return t;
}